

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writeSolutionFile(FILE *file,HighsOptions *options,HighsModel *model,HighsBasis *basis,
                      HighsSolution *solution,HighsInfo *info,HighsModelStatus model_status,
                      HighsInt style)

{
  size_type sVar1;
  undefined8 uVar2;
  pointer pvVar3;
  byte *in_RCX;
  long in_RDX;
  uint uVar4;
  long in_RSI;
  byte *in_R8;
  uint uVar5;
  HighsLogOptions *log_options_;
  int in_stack_00000010;
  HighsSolution *in_stack_00000090;
  HighsBasis *in_stack_00000098;
  HighsLp *in_stack_000000a0;
  HighsLogOptions *in_stack_000000a8;
  FILE *in_stack_000000b0;
  bool in_stack_0000017f;
  HighsInfo *in_stack_00000180;
  HighsSolution *in_stack_00000188;
  stringstream ss_1;
  HighsLogOptions *in_stack_00000198;
  FILE *in_stack_000001a0;
  bool sparse;
  bool raw;
  array<char,_32UL> objStr;
  stringstream ss;
  HighsVarType *integrality;
  HighsLogOptions *log_options;
  HighsLp *lp;
  bool have_basis;
  bool have_dual;
  bool have_primal;
  bool in_stack_000018db;
  HighsModelStatus in_stack_000018dc;
  HighsSolution *in_stack_000018e0;
  HighsBasis *in_stack_000018e8;
  HighsModel *in_stack_000018f0;
  HighsOptions *in_stack_000018f8;
  FILE *in_stack_00001900;
  HighsInfo *in_stack_00001910;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  HighsLogOptions *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  double tolerance;
  stringstream *psVar6;
  undefined8 in_stack_fffffffffffffa28;
  HighsModelStatus HVar7;
  HighsVarType *local_5a0;
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  stringstream local_518 [16];
  ostream local_508;
  allocator local_389;
  string local_388 [38];
  undefined1 local_362;
  undefined1 local_361;
  string local_360 [32];
  string local_340 [32];
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [29];
  undefined1 in_stack_fffffffffffffd25;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd30;
  HighsInt in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  HighsLogOptions *in_stack_fffffffffffffd40;
  FILE *in_stack_fffffffffffffd48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd60;
  string local_298 [8];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  string local_278 [8];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_fffffffffffffd90;
  HighsVarType *in_stack_fffffffffffffd98;
  string local_258 [32];
  stringstream local_238 [16];
  stringstream local_228 [144];
  allocator local_99;
  string local_98 [32];
  HighsVarType *local_78;
  double local_70;
  byte local_5b;
  byte local_5a;
  byte local_59;
  byte *local_50;
  
  HVar7 = (HighsModelStatus)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  local_59 = *in_R8 & 1;
  local_5a = in_R8[1] & 1;
  local_5b = *in_RCX & 1;
  local_70 = (double)(in_RSI + 0x380);
  if (in_stack_00000010 == -1) {
    writeOldRawSolution(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                        in_stack_00000090);
  }
  else if (in_stack_00000010 == 1) {
    local_50 = in_R8;
    sVar1 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDX + 0x178));
    if (sVar1 == 0) {
      local_5a0 = (HighsVarType *)0x0;
    }
    else {
      local_5a0 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x50b5d5);
    }
    local_78 = local_5a0;
    writeModelBoundSolution
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
               in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd27,in_stack_fffffffffffffd70,
               (bool)in_stack_fffffffffffffd26,in_stack_fffffffffffffd80,
               (bool)in_stack_fffffffffffffd25,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
    log_options_ = (HighsLogOptions *)(local_50 + 0x38);
    uVar4 = local_5a & 1;
    uVar5 = local_59 & 1;
    writeModelBoundSolution
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
               in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd27,in_stack_fffffffffffffd70,
               (bool)in_stack_fffffffffffffd26,in_stack_fffffffffffffd80,
               (bool)in_stack_fffffffffffffd25,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"\n",&local_99);
    highsFprintfString((FILE *)CONCAT44(in_stack_fffffffffffff974,uVar4),log_options_,
                       (string *)CONCAT44(in_stack_fffffffffffff964,uVar5));
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    psVar6 = local_238;
    std::__cxx11::stringstream::stringstream(psVar6);
    std::__cxx11::string::string(local_258);
    std::__cxx11::stringstream::str((string *)psVar6);
    HVar7 = (HighsModelStatus)((ulong)psVar6 >> 0x20);
    std::__cxx11::string::~string(local_258);
    psVar6 = local_238 + 0x10;
    utilModelStatusToString_abi_cxx11_(HVar7);
    uVar2 = std::__cxx11::string::c_str();
    highsFormatToString_abi_cxx11_((char *)local_278,"Model status: %s\n",uVar2);
    std::operator<<((ostream *)psVar6,local_278);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_298);
    tolerance = local_70;
    std::__cxx11::stringstream::str();
    highsFprintfString((FILE *)CONCAT44(in_stack_fffffffffffff974,uVar4),log_options_,
                       (string *)CONCAT44(in_stack_fffffffffffff964,uVar5));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd48);
    highsDoubleToString((double)psVar6,tolerance);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"\n",&local_2f9);
    highsFprintfString((FILE *)CONCAT44(in_stack_fffffffffffff974,uVar4),log_options_,
                       (string *)CONCAT44(in_stack_fffffffffffff964,uVar5));
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    std::__cxx11::string::string(local_320);
    std::__cxx11::stringstream::str((string *)local_238);
    std::__cxx11::string::~string(local_320);
    pvVar3 = std::array<char,_32UL>::data((array<char,_32UL> *)0x50ba0d);
    highsFormatToString_abi_cxx11_((char *)local_340,"Objective value: %s\n",pvVar3);
    std::operator<<((ostream *)(local_238 + 0x10),local_340);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::stringstream::str();
    highsFprintfString((FILE *)CONCAT44(in_stack_fffffffffffff974,uVar4),log_options_,
                       (string *)CONCAT44(in_stack_fffffffffffff964,uVar5));
    std::__cxx11::string::~string(local_360);
    std::__cxx11::stringstream::~stringstream(local_238);
  }
  else if ((in_stack_00000010 == 2) || (in_stack_00000010 == 3)) {
    local_361 = in_stack_00000010 == 2;
    writeGlpsolSolution(in_stack_00001900,in_stack_000018f8,in_stack_000018f0,in_stack_000018e8,
                        in_stack_000018e0,in_stack_000018dc,in_stack_00001910,in_stack_000018db);
  }
  else {
    local_362 = in_stack_00000010 == 4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"Model status\n",&local_389);
    highsFprintfString((FILE *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       in_stack_fffffffffffff968,
                       (string *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::stringstream::stringstream(local_518);
    std::__cxx11::string::string(local_538);
    std::__cxx11::stringstream::str((string *)local_518);
    std::__cxx11::string::~string(local_538);
    utilModelStatusToString_abi_cxx11_(HVar7);
    uVar2 = std::__cxx11::string::c_str();
    highsFormatToString_abi_cxx11_((char *)local_558,"%s\n",uVar2);
    std::operator<<(&local_508,local_558);
    std::__cxx11::string::~string(local_558);
    std::__cxx11::string::~string(local_578);
    std::__cxx11::stringstream::str();
    highsFprintfString((FILE *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       in_stack_fffffffffffff968,
                       (string *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    std::__cxx11::string::~string(local_598);
    writeModelSolution(in_stack_000001a0,in_stack_00000198,_ss_1,in_stack_00000188,in_stack_00000180
                       ,in_stack_0000017f);
    std::__cxx11::stringstream::~stringstream(local_518);
  }
  return;
}

Assistant:

void writeSolutionFile(FILE* file, const HighsOptions& options,
                       const HighsModel& model, const HighsBasis& basis,
                       const HighsSolution& solution, const HighsInfo& info,
                       const HighsModelStatus model_status,
                       const HighsInt style) {
  const bool have_primal = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  const bool have_basis = basis.valid;
  const HighsLp& lp = model.lp_;
  const HighsLogOptions& log_options = options.log_options;
  if (style == kSolutionStyleOldRaw) {
    writeOldRawSolution(file, log_options, lp, basis, solution);
  } else if (style == kSolutionStylePretty) {
    const HighsVarType* integrality =
        lp.integrality_.size() > 0 ? lp.integrality_.data() : nullptr;
    writeModelBoundSolution(file, log_options, true, lp.num_col_, lp.col_lower_,
                            lp.col_upper_, lp.col_names_, have_primal,
                            solution.col_value, have_dual, solution.col_dual,
                            have_basis, basis.col_status, integrality);
    writeModelBoundSolution(file, log_options, false, lp.num_row_,
                            lp.row_lower_, lp.row_upper_, lp.row_names_,
                            have_primal, solution.row_value, have_dual,
                            solution.row_dual, have_basis, basis.row_status);
    highsFprintfString(file, log_options, "\n");
    std::stringstream ss;
    ss.str(std::string());
    ss << highsFormatToString("Model status: %s\n",
                              utilModelStatusToString(model_status).c_str());
    highsFprintfString(file, log_options, ss.str());
    auto objStr = highsDoubleToString((double)info.objective_function_value,
                                      kHighsSolutionValueToStringTolerance);
    highsFprintfString(file, log_options, "\n");
    ss.str(std::string());
    ss << highsFormatToString("Objective value: %s\n", objStr.data());
    highsFprintfString(file, log_options, ss.str());
  } else if (style == kSolutionStyleGlpsolRaw ||
             style == kSolutionStyleGlpsolPretty) {
    const bool raw = style == kSolutionStyleGlpsolRaw;
    writeGlpsolSolution(file, options, model, basis, solution, model_status,
                        info, raw);
  } else {
    // Standard raw solution file, possibly sparse => only nonzero primal values
    const bool sparse = style == kSolutionStyleSparse;
    assert(style == kSolutionStyleRaw || sparse);
    highsFprintfString(file, log_options, "Model status\n");
    std::stringstream ss;
    ss.str(std::string());
    ss << highsFormatToString("%s\n",
                              utilModelStatusToString(model_status).c_str());
    highsFprintfString(file, log_options, ss.str());
    writeModelSolution(file, log_options, model, solution, info, sparse);
  }
}